

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O3

void GetSmoke(Pixel *pixel)

{
  int iVar1;
  long lVar2;
  
  iVar1 = rand();
  pixel->pixelType = Smoke;
  (pixel->color).a = 0xff;
  lVar2 = (long)plantColorsIndexes
                [iVar1 + ((uint)((ulong)((long)iVar1 * 0x66666667) >> 0x21) - (iVar1 >> 0x1f)) * -5
                 & 0xff];
  iVar1 = smokeColors[lVar2 + 1];
  (pixel->color).r = (uint8_t)smokeColors[lVar2];
  (pixel->color).g = (uint8_t)iVar1;
  (pixel->color).b = (uint8_t)smokeColors[lVar2 + 2];
  pixel->density = 0;
  pixel->flameable = false;
  return;
}

Assistant:

void GetSmoke(struct Pixel* pixel) {
    uint8_t randomColorIndex = rand() % 5;
    pixel->pixelType = Smoke;
    pixel->color.a = 255;
    pixel->color.r = smokeColors[smokeColorsIndexes[randomColorIndex]];
    pixel->color.g = smokeColors[smokeColorsIndexes[randomColorIndex] + 1];
    pixel->color.b = smokeColors[smokeColorsIndexes[randomColorIndex] + 2];
    pixel->density = 0;
    pixel->flameable = false;
}